

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  xml_node xVar1;
  unspecified_bool_type p_Var2;
  bool bVar3;
  xml_node local_68;
  xml_node_struct *local_60;
  xml_node_struct *j;
  char_t *local_50;
  char_t *next_segment;
  char_t *path_segment_end;
  char_t *path_segment;
  xml_node local_30;
  xml_node found;
  char_t *pcStack_20;
  char_t delimiter_local;
  char_t *path__local;
  xml_node *this_local;
  xml_node subsearch;
  
  local_30 = (xml_node)this->_root;
  xVar1._root = local_30._root;
  if (((this->_root != (xml_node_struct *)0x0) &&
      (xVar1._root = local_30._root, path_ != (char_t *)0x0)) &&
     (xVar1._root = local_30._root, *path_ != '\0')) {
    found._root._7_1_ = delimiter;
    pcStack_20 = path_;
    if (*path_ == delimiter) {
      path_segment = (char_t *)root(&local_30);
      pcStack_20 = path_ + 1;
      local_30 = (xml_node)path_segment;
    }
    for (path_segment_end = pcStack_20; *path_segment_end == found._root._7_1_;
        path_segment_end = path_segment_end + 1) {
    }
    next_segment = path_segment_end;
    while( true ) {
      bVar3 = false;
      if (*next_segment != '\0') {
        bVar3 = *next_segment != found._root._7_1_;
      }
      if (!bVar3) break;
      next_segment = next_segment + 1;
    }
    if (path_segment_end == next_segment) {
      this_local = (xml_node *)local_30._root;
      xVar1._root = (xml_node_struct *)this_local;
    }
    else {
      for (local_50 = next_segment; *local_50 == found._root._7_1_; local_50 = local_50 + 1) {
      }
      if ((*path_segment_end == '.') && (path_segment_end + 1 == next_segment)) {
        xVar1 = first_element_by_path(&local_30,local_50,found._root._7_1_);
      }
      else if ((*path_segment_end == '.') &&
              ((path_segment_end[1] == '.' && (path_segment_end + 2 == next_segment)))) {
        j = (xml_node_struct *)parent(&local_30);
        xVar1 = first_element_by_path((xml_node *)&j,local_50,found._root._7_1_);
      }
      else {
        for (local_60 = (local_30._root)->first_child; local_60 != (xml_node_struct *)0x0;
            local_60 = local_60->next_sibling) {
          if ((local_60->name != (char_t *)0x0) &&
             (bVar3 = impl::anon_unknown_0::strequalrange
                                (local_60->name,path_segment_end,
                                 (long)next_segment - (long)path_segment_end), bVar3)) {
            xml_node(&local_68,local_60);
            this_local = (xml_node *)first_element_by_path(&local_68,local_50,found._root._7_1_);
            p_Var2 = operator_cast_to_function_pointer((xml_node *)&this_local);
            if (p_Var2 != (unspecified_bool_type)0x0) {
              return (xml_node)(xml_node_struct *)this_local;
            }
          }
        }
        xml_node((xml_node *)&this_local);
        xVar1._root = (xml_node_struct *)this_local;
      }
    }
  }
  this_local = (xml_node *)xVar1._root;
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI__FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node found = *this; // Current search context.

		if (!_root || !path_ || !path_[0]) return found;

		if (path_[0] == delimiter)
		{
			// Absolute path; e.g. '/foo/bar'
			found = found.root();
			++path_;
		}

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return found;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return found.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return found.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = found._root->first_child; j; j = j->next_sibling)
			{
				if (j->name && impl::strequalrange(j->name, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}